

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e_des.c
# Opt level: O0

int des_ofb_cipher(EVP_CIPHER_CTX *ctx,uchar *out,uchar *in,size_t inl)

{
  ulong length;
  uchar *puVar1;
  uchar *puVar2;
  DES_key_schedule *pDVar3;
  ulong in_RCX;
  uchar *in_RDX;
  uchar *in_RSI;
  EVP_CIPHER_CTX *in_RDI;
  int in_stack_0000002c;
  int num_1;
  int num;
  int local_28;
  int local_24;
  ulong local_20;
  uchar *local_18;
  uchar *local_10;
  EVP_CIPHER_CTX *local_8;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  for (local_20 = in_RCX; 0x3fffffffffffffff < local_20; local_20 = local_20 + 0xc000000000000000) {
    local_24 = EVP_CIPHER_CTX_get_num((EVP_CIPHER_CTX *)in);
    puVar2 = local_10;
    puVar1 = local_18;
    pDVar3 = (DES_key_schedule *)EVP_CIPHER_CTX_get_cipher_data(local_8);
    DES_ofb64_encrypt(puVar1,puVar2,0x4000000000000000,pDVar3,(DES_cblock *)local_8->iv,&local_24);
    EVP_CIPHER_CTX_set_num(_num_1,in_stack_0000002c);
    local_18 = local_18 + 0x4000000000000000;
    local_10 = local_10 + 0x4000000000000000;
  }
  if (local_20 != 0) {
    local_28 = EVP_CIPHER_CTX_get_num((EVP_CIPHER_CTX *)in);
    puVar2 = local_10;
    puVar1 = local_18;
    length = local_20;
    pDVar3 = (DES_key_schedule *)EVP_CIPHER_CTX_get_cipher_data(local_8);
    DES_ofb64_encrypt(puVar1,puVar2,length,pDVar3,(DES_cblock *)local_8->iv,&local_28);
    EVP_CIPHER_CTX_set_num(_num_1,in_stack_0000002c);
  }
  return 1;
}

Assistant:

static int des_ofb_cipher(EVP_CIPHER_CTX *ctx, unsigned char *out,
                          const unsigned char *in, size_t inl)
{
    while (inl >= EVP_MAXCHUNK) {
        int num = EVP_CIPHER_CTX_get_num(ctx);
        DES_ofb64_encrypt(in, out, (long)EVP_MAXCHUNK,
                          EVP_CIPHER_CTX_get_cipher_data(ctx),
                          (DES_cblock *)ctx->iv, &num);
        EVP_CIPHER_CTX_set_num(ctx, num);
        inl -= EVP_MAXCHUNK;
        in += EVP_MAXCHUNK;
        out += EVP_MAXCHUNK;
    }
    if (inl) {
        int num = EVP_CIPHER_CTX_get_num(ctx);
        DES_ofb64_encrypt(in, out, (long)inl,
                          EVP_CIPHER_CTX_get_cipher_data(ctx),
                          (DES_cblock *)ctx->iv, &num);
        EVP_CIPHER_CTX_set_num(ctx, num);
    }
    return 1;
}